

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

hwaddr do_translate_address
                 (CPUMIPSState_conflict5 *env,target_ulong address,int rw,uintptr_t retaddr)

{
  CPUState *cpu;
  hwaddr hVar1;
  CPUState *cs;
  hwaddr paddr;
  uintptr_t retaddr_local;
  int rw_local;
  target_ulong address_local;
  CPUMIPSState_conflict5 *env_local;
  
  cpu = env_cpu(env);
  hVar1 = cpu_mips_translate_address_mips64el(env,address,rw);
  if (hVar1 == 0xffffffffffffffff) {
    cpu_loop_exit_restore_mips64el(cpu,retaddr);
  }
  return hVar1;
}

Assistant:

static inline hwaddr do_translate_address(CPUMIPSState *env,
                                                      target_ulong address,
                                                      int rw, uintptr_t retaddr)
{
    hwaddr paddr;
    CPUState *cs = env_cpu(env);

    paddr = cpu_mips_translate_address(env, address, rw);

    if (paddr == -1LL) {
        cpu_loop_exit_restore(cs, retaddr);
    } else {
        return paddr;
    }
}